

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

void __thiscall duckdb::Serializer::WriteValue<bool>(Serializer *this,vector<bool,_true> *vec)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  int iVar4;
  ulong *puVar5;
  
  (*this->_vptr_Serializer[8])
            (this,(ulong)(vec->super_vector<bool,_std::allocator<bool>_>).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_finish.super__Bit_iterator_base._M_offset +
                  ((long)(vec->super_vector<bool,_std::allocator<bool>_>).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_finish.super__Bit_iterator_base._M_p -
                  (long)(vec->super_vector<bool,_std::allocator<bool>_>).
                        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                        _M_start.super__Bit_iterator_base._M_p) * 8);
  puVar5 = (vec->super_vector<bool,_std::allocator<bool>_>).
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._M_p;
  puVar2 = (vec->super_vector<bool,_std::allocator<bool>_>).
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._M_p;
  uVar1 = (vec->super_vector<bool,_std::allocator<bool>_>).
          super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
          super__Bit_iterator_base._M_offset;
  if (uVar1 != 0 || puVar5 != puVar2) {
    uVar3 = 0;
    do {
      (*this->_vptr_Serializer[0xe])(this,(ulong)((*puVar5 >> (uVar3 & 0x3f) & 1) != 0));
      iVar4 = (int)uVar3;
      puVar5 = puVar5 + (iVar4 == 0x3f);
      uVar3 = (ulong)(iVar4 + 1);
      if (iVar4 == 0x3f) {
        uVar3 = 0;
      }
    } while ((uint)uVar3 != uVar1 || puVar5 != puVar2);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void Serializer::WriteValue(const vector<bool> &vec) {
	auto count = vec.size();
	OnListBegin(count);
	for (auto item : vec) {
		WriteValue(item);
	}
	OnListEnd();
}